

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mldsa_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_7f38dd::MLDSATest_PWCT_Test::~MLDSATest_PWCT_Test(MLDSATest_PWCT_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(MLDSATest, PWCT) {
  uint8_t seed[BCM_MLDSA_SEED_BYTES];

  auto pub65 = std::make_unique<uint8_t[]>(BCM_MLDSA65_PUBLIC_KEY_BYTES);
  auto priv65 = std::make_unique<BCM_mldsa65_private_key>();
  ASSERT_EQ(BCM_mldsa65_generate_key_fips(pub65.get(), seed, priv65.get()),
            bcm_status::approved);

  auto pub87 = std::make_unique<uint8_t[]>(BCM_MLDSA87_PUBLIC_KEY_BYTES);
  auto priv87 = std::make_unique<BCM_mldsa87_private_key>();
  ASSERT_EQ(BCM_mldsa87_generate_key_fips(pub87.get(), seed, priv87.get()),
            bcm_status::approved);
}